

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PickNegLogSoftmax::forward_impl
          (PickNegLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  const_reference ppTVar2;
  void *pvVar3;
  Scalar *pSVar4;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *this_00;
  size_type sVar5;
  runtime_error *this_01;
  ulong index;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Tensor *in_RDI;
  float fVar6;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_00000030;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x_1;
  uint b;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  size_t in_stack_ffffffffffffff68;
  AlignedMemoryPool<6U> *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff94;
  Tensor *in_stack_ffffffffffffff98;
  uint local_3c;
  
  ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar1 = Dim::cols(&(*ppTVar2)->d);
  if (uVar1 != 1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"PickNegLogSoftmax::forward not yet implemented for multiple columns");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Dim::batch_elems(in_RDX);
  pvVar3 = AlignedMemoryPool<6U>::allocate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(void **)(in_RDI[1].d.d + 2) = pvVar3;
  if (*(long *)(in_RDI[1].d.d + 6) == 0) {
    if (in_RDI[1].bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x48d,
                    "virtual void cnn::PickNegLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    this_00 = (DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_RDI[1].bs.
                            super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                            super__Vector_impl_data._M_finish);
    uVar1 = Dim::batch_elems(in_RDX);
    if (this_00 !=
        (DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         *)(ulong)uVar1) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x48e,
                    "virtual void cnn::PickNegLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    local_3c = 0;
    while( true ) {
      index = (ulong)local_3c;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_RDI[1].bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      if (sVar5 <= index) break;
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
      Tensor::batch_matrix(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      fVar6 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                        (in_stack_00000030);
      *(float *)(*(long *)(in_RDI[1].d.d + 2) + (ulong)local_3c * 4) = fVar6;
      fVar6 = *(float *)(*(long *)(in_RDI[1].d.d + 2) + (ulong)local_3c * 4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_RDI[1].bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)local_3c);
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(this_00,index);
      *(float *)(*(long *)(in_RDX[1].d + 1) + (ulong)local_3c * 4) = fVar6 - *pSVar4;
      local_3c = local_3c + 1;
    }
  }
  else {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_RDI);
    fVar6 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                      (in_stack_00000030);
    **(float **)(in_RDI[1].d.d + 2) = fVar6;
    fVar6 = **(float **)(in_RDI[1].d.d + 2);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    **(float **)(in_RDX[1].d + 1) = fVar6 - *pSVar4;
  }
  return;
}

Assistant:

void PickNegLogSoftmax::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
    logz = (float*)fxs->allocate(sizeof(float)*fx.d.batch_elems());
#if HAVE_CUDA
    if(pval) {
      gpu::pnlsoftmax(xs[0]->d.size(), *pval, xs[0]->v, fx.v, logz);
    } else {
      // TODO: It'd be nice to have a kernel that did all batches at once
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems());
      for(unsigned b = 0; b < pvals->size(); ++b)
        gpu::pnlsoftmax(xs[0]->d.batch_size(), (*pvals)[b], xs[0]->batch_ptr(b), fx.v+b, logz+b);
    }
#else
    if(pval) {
      auto x = **xs[0];
      *logz = logsumexp(x);
      fx.v[0] = *logz - x(*pval);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems());
      for(unsigned b = 0; b < pvals->size(); ++b) {
        auto x = xs[0]->batch_matrix(b);
        logz[b] = logsumexp(x);
        fx.v[b] = logz[b] - x((*pvals)[b]);
      }
    }
#endif
  } else {
    throw std::runtime_error("PickNegLogSoftmax::forward not yet implemented for multiple columns");
  }
}